

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void __thiscall QList<QWidgetItemData>::reserve(QList<QWidgetItemData> *this,qsizetype asize)

{
  ArrayOptions *pAVar1;
  QWidgetItemData *pQVar2;
  uint uVar3;
  Data *pDVar4;
  QWidgetItemData *pQVar5;
  long lVar6;
  QWidgetItemData *data;
  QWidgetItemData *pQVar7;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayDataPointer<QWidgetItemData> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->d).d;
  if ((pDVar4 != (Data *)0x0) &&
     (asize <= ((long)((long)(this->d).ptr -
                      ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0))
               >> 3) * 0x3333333333333333 + (pDVar4->super_QArrayData).alloc)) {
    uVar3 = (pDVar4->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
            super_QFlagsStorage<QArrayData::ArrayOption>.i;
    if ((uVar3 & 1) != 0) goto LAB_00581a75;
    if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 1) {
      (pDVar4->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
      super_QFlagsStorage<QArrayData::ArrayOption>.i = uVar3 | 1;
      goto LAB_00581a75;
    }
  }
  lVar6 = (this->d).size;
  if (asize < lVar6) {
    asize = lVar6;
  }
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar5 = (QWidgetItemData *)
           QArrayData::allocate((QArrayData **)&local_48,0x28,0x10,asize,KeepSize);
  local_48.size = 0;
  lVar6 = (this->d).size;
  local_48.ptr = pQVar5;
  if (lVar6 < 1) {
    lVar6 = 0;
  }
  else {
    pQVar7 = (this->d).ptr;
    pQVar2 = pQVar7 + lVar6;
    do {
      pQVar5[local_48.size].role = pQVar7->role;
      ::QVariant::QVariant(&pQVar5[local_48.size].value,&pQVar7->value);
      lVar6 = local_48.size + 1;
      pQVar7 = pQVar7 + 1;
      local_48.size = lVar6;
    } while (pQVar7 < pQVar2);
  }
  if (local_48.d != (Data *)0x0) {
    pAVar1 = &((local_48.d)->super_QArrayData).flags;
    *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
              super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
               super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
  }
  pDVar4 = (this->d).d;
  pQVar5 = (this->d).ptr;
  (this->d).d = local_48.d;
  (this->d).ptr = local_48.ptr;
  local_48.size = (this->d).size;
  (this->d).size = lVar6;
  local_48.d = pDVar4;
  local_48.ptr = pQVar5;
  QArrayDataPointer<QWidgetItemData>::~QArrayDataPointer(&local_48);
LAB_00581a75:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QList<T>::reserve(qsizetype asize)
{
    // capacity() == 0 for immutable data, so this will force a detaching below
    if (asize <= capacity() - d.freeSpaceAtBegin()) {
        if (d->flags() & Data::CapacityReserved)
            return;  // already reserved, don't shrink
        if (!d->isShared()) {
            // accept current allocation, don't shrink
            d->setFlag(Data::CapacityReserved);
            return;
        }
    }

    DataPointer detached(qMax(asize, size()));
    detached->copyAppend(d->begin(), d->end());
    if (detached.d_ptr())
        detached->setFlag(Data::CapacityReserved);
    d.swap(detached);
}